

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O3

bool __thiscall
SuperCardPro::WriteFlux
          (SuperCardPro *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *flux_times)

{
  pointer puVar1;
  SuperCardPro *this_00;
  bool bVar2;
  uint uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  pointer puVar7;
  vector<unsigned_short,_std::allocator<unsigned_short>_> flux_data;
  uint32_t start_len [2];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  uint local_48;
  uint local_44;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  SuperCardPro *local_38;
  
  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_short *)0x0;
  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_38 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            (&local_68,
             (long)(flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  puVar7 = (flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (flux_times->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 != puVar1) {
    do {
      uVar3 = ((*puVar7 + 0xc) / 0x19) * opt.scale;
      uVar5 = uVar3 / 100 | 1;
      if (0x63ffff < uVar3) {
        do {
          local_48 = local_48 & 0xffff0000;
          if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>
                      (&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_48);
          }
          else {
            *local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar5 = uVar5 - 0x10000;
        } while (0xffff < uVar5);
      }
      uVar4 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
      local_48 = CONCAT22(local_48._2_2_,uVar4);
      if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_48);
      }
      else {
        *local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar4;
        local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar1);
  }
  this_00 = local_38;
  if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_48 = CONCAT22(local_48._2_2_,0xa0);
    if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
      _M_realloc_insert<unsigned_short>
                (&local_68,
                 (iterator)
                 local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(unsigned_short *)&local_48);
    }
    else {
      *local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_finish = 0xa0;
      local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  lVar6 = (long)local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start >> 1;
  local_48 = 0;
  uVar3 = (int)lVar6 * 2;
  local_44 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | (int)lVar6 << 0x19;
  bVar2 = SendCmd(this_00,0xaa,&local_48,8,
                  local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start,uVar3);
  if (bVar2) {
    local_3d = (undefined1)((ulong)lVar6 >> 0x18);
    local_3c = (undefined1)((ulong)lVar6 >> 0x10);
    local_3b = (undefined1)((ulong)lVar6 >> 8);
    local_3a = (undefined1)lVar6;
    local_39 = 5;
    bVar2 = SendCmd(this_00,0xa2,&local_3d,5,(void *)0x0,0);
  }
  else {
    bVar2 = false;
  }
  if (local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool SuperCardPro::WriteFlux(const std::vector<uint32_t>& flux_times)
{
    std::vector<uint16_t> flux_data;
    flux_data.reserve(flux_times.size());
    for (auto time_ns : flux_times)
    {
        auto time_ticks{ (time_ns + (NS_PER_TICK / 2)) / NS_PER_TICK };
        time_ticks = time_ticks * opt.scale / 100;
        time_ticks |= 1;

        while (time_ticks >= 0x10000)
        {
            flux_data.push_back(0);
            time_ticks -= 0x10000;
        }

        flux_data.push_back(util::htobe(static_cast<uint16_t>(time_ticks)));
    }

    if (flux_data.empty())
        flux_data.push_back(4'000 / NS_PER_TICK);

    auto flux_count{ flux_data.size() };
    auto flux_bytes{ flux_count * sizeof(flux_data[0]) };

    uint32_t start_len[2];
    start_len[0] = 0;
    start_len[1] = util::htobe(static_cast<uint32_t>(flux_bytes));
    if (!SendCmd(CMD_LOADRAM_USB, &start_len, static_cast<int>(sizeof(start_len)), flux_data.data(), static_cast<int>(flux_bytes)))
        return false;

    uint8_t params[5] = {};
    params[0] = static_cast<uint8_t>(flux_count >> 24); // big endian
    params[1] = static_cast<uint8_t>(flux_count >> 16);
    params[2] = static_cast<uint8_t>(flux_count >> 8);
    params[3] = static_cast<uint8_t>(flux_count);
    params[4] = ff_Wipe | ff_Index;

    if (!SendCmd(CMD_WRITEFLUX, &params, sizeof(params)))
        return false;

    return true;
}